

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentBeforeValue(BuiltStyledStreamWriter *this,Value *root)

{
  _Alloc_hider _Var1;
  char local_41;
  string local_40;
  
  if (((this->cs_ != None) && (root->comments_ != (CommentInfo *)0x0)) &&
     (root->comments_->comment_ != (char *)0x0)) {
    if ((this->field_0xd8 & 2) == 0) {
      writeIndent(this);
    }
    Value::getComment_abi_cxx11_(&local_40,root,commentBefore);
    if (local_40._M_string_length != 0) {
      _Var1._M_p = local_40._M_dataplus._M_p;
      do {
        local_41 = *_Var1._M_p;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->super_StreamWriter).sout_,&local_41,1);
        if ((_Var1._M_p != local_40._M_dataplus._M_p + local_40._M_string_length &&
             *_Var1._M_p == '\n') && (_Var1._M_p[1] == '/')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->super_StreamWriter).sout_,(this->indentString_)._M_dataplus._M_p,
                     (this->indentString_)._M_string_length);
        }
        _Var1._M_p = _Var1._M_p + 1;
      } while (_Var1._M_p != local_40._M_dataplus._M_p + local_40._M_string_length);
    }
    this->field_0xd8 = this->field_0xd8 & 0xfd;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentBeforeValue(Value const& root) {
  if (cs_ == CommentStyle::None) return;
  if (!root.hasComment(commentBefore))
    return;

  if (!indented_) writeIndent();
  const JSONCPP_STRING& comment = root.getComment(commentBefore);
  JSONCPP_STRING::const_iterator iter = comment.begin();
  while (iter != comment.end()) {
    *sout_ << *iter;
    if (*iter == '\n' &&
       (iter != comment.end() && *(iter + 1) == '/'))
      // writeIndent();  // would write extra newline
      *sout_ << indentString_;
    ++iter;
  }
  indented_ = false;
}